

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O1

string * __thiscall
DDSInfo::PrintD3DFormatFlagNames_abi_cxx11_(string *__return_storage_ptr__,DDSInfo *this,uint flags)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((ulong)this & 0x14) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x14) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x14) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x15)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x15) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x15) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x15) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x16)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x16) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x16) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x16) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x17)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x17) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x17) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x17) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x18)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x18) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x18) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x18) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x19)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x19) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x19) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x19) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x1a)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1a) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1a) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1a) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x1b)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1b) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1b) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1b) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x1c)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1c) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1c) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1c) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x1d)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1d) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1d) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1d) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x1e)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1e) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1e) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1e) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x1f)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x1f) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x1f) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x1f) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x20)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x20) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x20) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x20) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x21)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x21) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x21) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x21) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x22)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x22) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x22) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x22) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x23)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x23) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x23) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x23) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x24)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x24) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x24) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x24) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x25)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x28) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x28) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x28) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x29)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x29) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x29) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x29) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x2a)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x32) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x32) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x32) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x33)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x33) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x33) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x33) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x34)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x34) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x34) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x34) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x35)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3c) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3c) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3c) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x3d)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3d) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3d) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3d) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x3e)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3e) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3e) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3e) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x3f)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x3f) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x3f) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x3f) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x40)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x40) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x40) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x40) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x41)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x43) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x43) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x43) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x44)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x51) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x51) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x51) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x52)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x6e) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x6e) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x6e) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x6f)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x6f) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x6f) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x6f) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x70)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x70) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x70) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x70) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x71)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x71) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x71) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x71) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x72)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x72) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x72) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x72) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x73)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x73) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x73) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x73) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x74)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x74) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x74) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x74) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x75)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x59565955) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x59565955) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x59565955) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x59565956)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x47424752) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x47424752) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x47424752) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x47424753)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x32595559) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x32595559) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x32595559) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x3259555a)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x42475247) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x42475247) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x42475247) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x42475248)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x31545844) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x31545844) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x31545844) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x31545845)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x32545844) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x32545844) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x32545844) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x32545845)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x33545844) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x33545844) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x33545844) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x33545845)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x34545844) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x34545844) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x34545844) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x34545845)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x35545844) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x35545844) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x35545844) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x35545845)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x32435450) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x32435450) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x32435450) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x32435451)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x34435450) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x34435450) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x34435450) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, *(uint *)(puVar2 + 4) < 0x34435451)) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  if (((ulong)this & 0x7fffffff) != 0) {
    puVar2 = &DAT_001434d8;
    if (DAT_001434e0 != (undefined8 *)0x0) {
      puVar2 = &DAT_001434d8;
      puVar1 = DAT_001434e0;
      do {
        if (*(uint *)(puVar1 + 4) >= 0x7fffffff) {
          puVar2 = puVar1;
        }
        puVar1 = (undefined8 *)puVar1[(ulong)(*(uint *)(puVar1 + 4) < 0x7fffffff) + 2];
      } while (puVar1 != (undefined8 *)0x0);
    }
    puVar1 = &DAT_001434d8;
    if ((puVar2 != &DAT_001434d8) && (puVar1 = &DAT_001434d8, -1 < *(int *)(puVar2 + 4))) {
      puVar1 = puVar2;
    }
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>((string *)local_48,puVar1[5],puVar1[6] + puVar1[5]);
    std::__cxx11::string::append((char *)local_48);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  RemoveTrailingCharacter(__return_storage_ptr__,'|');
  return __return_storage_ptr__;
}

Assistant:

std::string PrintD3DFormatFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,d3d_format_names)
    #include "defs/dds/d3d_formats.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }